

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O2

TestResult *
JsonTest::checkStringEqual
          (TestResult *result,string *expected,string *actual,char *file,uint line,char *expr)

{
  bool bVar1;
  TestResult *pTVar2;
  
  bVar1 = std::operator!=(expected,actual);
  if (bVar1) {
    TestResult::addFailure(result,file,line,expr);
    pTVar2 = TestResult::operator<<(result,(char (*) [12])"Expected: \'");
    pTVar2 = TestResult::operator<<(pTVar2,expected);
    TestResult::operator<<(pTVar2,(char (*) [3])0x14da25);
    pTVar2 = TestResult::operator<<(result,(char (*) [12])"Actual  : \'");
    pTVar2 = TestResult::operator<<(pTVar2,actual);
    TestResult::operator<<(pTVar2,(char (*) [2])0x1492c8);
  }
  return result;
}

Assistant:

TestResult& checkStringEqual(TestResult& result,
                             const std::string& expected,
                             const std::string& actual,
                             const char* file,
                             unsigned int line,
                             const char* expr) {
  if (expected != actual) {
    result.addFailure(file, line, expr);
    result << "Expected: '" << expected << "'\n";
    result << "Actual  : '" << actual << "'";
  }
  return result;
}